

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O3

ON__UINT32 on_random_number(ON_RANDOM_NUMBER_CONTEXT *randcontext)

{
  ON__UINT32 OVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar2 = randcontext->mti;
  if ((ulong)uVar2 < 0x270) {
    uVar4 = randcontext->mt[uVar2];
    OVar1 = uVar2 + 1;
  }
  else {
    if (uVar2 == 0x270) {
      uVar2 = randcontext->mt[0];
    }
    else {
      randcontext->mt[0] = 0x1571;
      uVar2 = 0x1571;
      lVar3 = 2;
      do {
        uVar2 = ((uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + (int)lVar3) - 1;
        randcontext->mt[lVar3 + -1] = uVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x271);
      randcontext->mti = 0x270;
      uVar2 = 0;
    }
    lVar3 = 0;
    do {
      uVar4 = uVar2 & 0x80000000;
      uVar2 = randcontext->mt[lVar3 + 1];
      randcontext->mt[lVar3] =
           on_random_number::mag01[uVar2 & 1] ^ randcontext->mt[lVar3 + 0x18d] ^
           (uVar2 & 0x7ffffffe | uVar4) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe3);
    uVar2 = randcontext->mt[0xe3];
    lVar3 = 0;
    do {
      uVar4 = uVar2 & 0x80000000;
      uVar2 = randcontext->mt[lVar3 + 0xe4];
      randcontext->mt[lVar3 + 0xe3] =
           on_random_number::mag01[uVar2 & 1] ^ randcontext->mt[lVar3] ^
           (uVar2 & 0x7ffffffe | uVar4) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18c);
    uVar4 = randcontext->mt[0];
    randcontext->mt[0x26f] =
         on_random_number::mag01[uVar4 & 1] ^ randcontext->mt[0x18c] ^
         (uVar4 & 0x7ffffffe | randcontext->mt[0x26f] & 0x80000000) >> 1;
    OVar1 = 1;
  }
  randcontext->mti = OVar1;
  uVar4 = uVar4 >> 0xb ^ uVar4;
  uVar4 = (uVar4 & 0x13a58ad) << 7 ^ uVar4;
  uVar4 = (uVar4 & 0x1df8c) << 0xf ^ uVar4;
  return uVar4 >> 0x12 ^ uVar4;
}

Assistant:

ON__UINT32 on_random_number(struct ON_RANDOM_NUMBER_CONTEXT* randcontext)
{
  static const ON__UINT32 mag01[2]={0x0UL, MATRIX_A};
  ON__UINT32 kk, y;
  /* mag01[x] = x * MATRIX_A  for x=0,1 */

  if (randcontext->mti >= N) 
  {
    /* generate N words at one time */
    if (randcontext->mti >= N+1)
    {
      /* if randcontext has never been initialized */
      on_random_number_seed(5489UL,randcontext); /* a default initial seed is used */
    }

    for (kk=0;kk<N-M;kk++)
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+M] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    for (;kk<N-1;kk++) 
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+(M-N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    y = (randcontext->mt[N-1]&UPPER_MASK)|(randcontext->mt[0]&LOWER_MASK);
    randcontext->mt[N-1] = randcontext->mt[M-1] ^ (y >> 1) ^ mag01[y & 0x1UL];

    randcontext->mti = 0;
  }

  y = randcontext->mt[randcontext->mti++];

  /* Tempering */
  y ^= (y >> 11);
  y ^= (y << 7) & 0x9d2c5680UL;
  y ^= (y << 15) & 0xefc60000UL;
  y ^= (y >> 18);

  return y;
}